

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O0

int zt_opt_long(int argn,int defn,int *argc,char **argv,zt_opt_def_t *def,zt_opt_error error)

{
  char *__nptr;
  int *piVar1;
  long lVar2;
  int in_ESI;
  long in_R8;
  char **in_R9;
  char *arg;
  int args_consumed;
  char *end;
  long result;
  uint in_stack_ffffffffffffffc0;
  int iVar3;
  char *pcVar4;
  zt_opt_def_t *in_stack_ffffffffffffffd0;
  char **ppcVar5;
  
  pcVar4 = (char *)0x0;
  iVar3 = 0;
  __nptr = zt_opt_get_value((int)((ulong)in_R8 >> 0x20),(int)in_R8,in_R9,in_stack_ffffffffffffffd0,
                            (int *)0x0,(zt_opt_error)(ulong)in_stack_ffffffffffffffc0);
  piVar1 = __errno_location();
  *piVar1 = 0;
  lVar2 = strtol(__nptr,(char **)&stack0xffffffffffffffc8,0);
  piVar1 = __errno_location();
  ppcVar5 = in_R9;
  if (*piVar1 != 0) {
    piVar1 = __errno_location();
    (*(code *)in_R9)(*piVar1,"invalid number \'%s\'",__nptr);
  }
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    (*(code *)ppcVar5)(0x16,"\'%s\' is not a number",__nptr);
  }
  if (*(long *)(in_R8 + (long)in_ESI * 0x30 + 0x20) != 0) {
    **(long **)(in_R8 + (long)in_ESI * 0x30 + 0x20) = lVar2;
  }
  return iVar3;
}

Assistant:

int
zt_opt_long(int argn, int defn, int * argc, char ** argv, zt_opt_def_t * def, zt_opt_error error) {
    long   result;
    char * end = NULL;
    int    args_consumed = 0;
    char * arg = zt_opt_get_value(argn, defn, argv, def, &args_consumed, error);

    errno  = 0;
    result = strtol(arg, &end, 0);

    if (errno) {
        /* check errno */
        error(errno, "invalid number '%s'", arg);
    }

    if (end && *end) {
        /* invalid character */
        error(EINVAL, "'%s' is not a number", arg);
    }

    if (def[defn].cb_data) {
        *(long *)def[defn].cb_data = result;
    }

    return args_consumed;
}